

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::EBMLHeader::Init(EBMLHeader *this)

{
  this->m_version = 1;
  this->m_readVersion = 1;
  this->m_maxIdLength = 4;
  this->m_maxSizeLength = 8;
  if (this->m_docType != (char *)0x0) {
    operator_delete__(this->m_docType);
    this->m_docType = (char *)0x0;
  }
  this->m_docTypeVersion = 1;
  this->m_docTypeReadVersion = 1;
  return;
}

Assistant:

void EBMLHeader::Init() {
  m_version = 1;
  m_readVersion = 1;
  m_maxIdLength = 4;
  m_maxSizeLength = 8;

  if (m_docType) {
    delete[] m_docType;
    m_docType = NULL;
  }

  m_docTypeVersion = 1;
  m_docTypeReadVersion = 1;
}